

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpj.cpp
# Opt level: O2

void __thiscall pg::FPJSolver::runSeqGreedy(FPJSolver *this)

{
  uint uVar1;
  uint uVar2;
  Game *pGVar3;
  bitset *pbVar4;
  int iVar5;
  void *pvVar6;
  ostream *poVar7;
  uint *puVar8;
  ulong uVar9;
  long lVar10;
  int v;
  uint uVar11;
  ulong uVar12;
  uint vertex;
  int *curedge;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  bool bVar16;
  int from;
  uint *puVar17;
  uint uVar18;
  int v_1;
  uint uVar19;
  _label_vertex local_c0;
  uintqueue Q;
  bitset parity;
  bitset distraction;
  bitset justified;
  
  uVar12 = ((this->super_Solver).game)->n_vertices;
  pvVar6 = operator_new__(-(ulong)(uVar12 >> 0x3e != 0) | uVar12 * 4);
  bitset::bitset(&justified,uVar12);
  bitset::bitset(&distraction,((this->super_Solver).game)->n_vertices);
  bitset::bitset(&parity,((this->super_Solver).game)->n_vertices);
  pGVar3 = (this->super_Solver).game;
  for (uVar12 = 0; uVar13 = pGVar3->n_vertices, (long)uVar12 < (long)uVar13; uVar12 = uVar12 + 1) {
    uVar13 = uVar12 >> 6;
    uVar15 = 1L << (uVar12 & 0x3f);
    if ((*(byte *)(pGVar3->_priority + uVar12) & 1) == 0) {
      uVar15 = ~uVar15 & parity._bits[uVar13];
    }
    else {
      uVar15 = uVar15 | parity._bits[uVar13];
    }
    parity._bits[uVar13] = uVar15;
  }
  Q.pointer = 0;
  Q.queue = (uint *)operator_new__((uVar13 & 0xffffffff) << 2);
  vertex = 0;
  bVar16 = false;
  uVar18 = (uint)*parity._bits & 1;
  do {
    uVar13 = (ulong)(int)vertex;
    uVar12 = ((this->super_Solver).game)->n_vertices;
    if (uVar12 == uVar13) {
LAB_0014f1cb:
      if (bVar16) {
        while (lVar10 = (long)Q.pointer, lVar10 != 0) {
          Q.pointer = Q.pointer + -1;
          pGVar3 = (this->super_Solver).game;
          uVar19 = Q.queue[lVar10 + -1];
          puVar17 = (uint *)(pGVar3->_inedges + pGVar3->_firstins[(int)uVar19]);
          puVar8 = Q.queue;
          while( true ) {
            uVar1 = *puVar17;
            uVar12 = (ulong)(int)uVar1;
            if (uVar12 == 0xffffffffffffffff) break;
            uVar15 = uVar12 >> 6;
            uVar13 = justified._bits[uVar15];
            if (((uVar13 >> (uVar12 & 0x3f) & 1) != 0) &&
               ((uVar2 = *(uint *)((long)pvVar6 + uVar12 * 4), uVar2 == 0xffffffff ||
                (uVar2 == uVar19)))) {
              if (1 < (this->super_Solver).trace) {
                poVar7 = std::operator<<((this->super_Solver).logger,"\x1b[31;1mresetting\x1b[m ");
                local_c0.g = (this->super_Solver).game;
                local_c0.v = uVar1;
                poVar7 = operator<<(poVar7,&local_c0);
                std::endl<char,std::char_traits<char>>(poVar7);
                uVar13 = justified._bits[uVar15];
                puVar8 = Q.queue;
              }
              uVar12 = 1L << (uVar12 & 0x3f);
              justified._bits[uVar15] = ~uVar12 & uVar13;
              distraction._bits[uVar15] = distraction._bits[uVar15] & ~uVar12;
              lVar10 = (long)Q.pointer;
              if ((int)uVar1 < (int)vertex) {
                vertex = uVar1;
              }
              Q.pointer = Q.pointer + 1;
              puVar8[lVar10] = uVar1;
            }
            puVar17 = puVar17 + 1;
          }
        }
        uVar13 = (ulong)(int)vertex;
        if ((this->super_Solver).trace != 0) {
          poVar7 = std::operator<<((this->super_Solver).logger,
                                   "restarting after finding distractions of prio ");
          poVar7 = (ostream *)
                   std::ostream::operator<<
                             (poVar7,((this->super_Solver).game)->_priority[uVar13 - 1]);
          std::endl<char,std::char_traits<char>>(poVar7);
        }
        this->iterations = this->iterations + 1;
        uVar12 = ((this->super_Solver).game)->n_vertices;
      }
      if (uVar12 == uVar13) {
        for (uVar12 = 0; (long)uVar12 < ((this->super_Solver).game)->n_vertices; uVar12 = uVar12 + 1
            ) {
          uVar13 = uVar12 >> 6;
          if ((((this->super_Solver).disabled)->_bits[uVar13] >> (uVar12 & 0x3f) & 1) == 0) {
            uVar14 = 1L << (uVar12 & 0x3f);
            uVar15 = parity._bits[uVar13];
            uVar13 = distraction._bits[uVar13];
            uVar18 = Solver::owner(&this->super_Solver,(int)uVar12);
            iVar5 = -1;
            uVar11 = (uint)(((uVar15 & uVar14) != 0) != ((uVar13 & uVar14) != 0));
            if (uVar18 == uVar11) {
              iVar5 = *(int *)((long)pvVar6 + uVar12 * 4);
            }
            Solver::solve(&this->super_Solver,(int)uVar12,uVar11,iVar5);
          }
        }
        operator_delete__(pvVar6);
        poVar7 = std::operator<<((this->super_Solver).logger,"solved with ");
        poVar7 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar7);
        poVar7 = std::operator<<(poVar7," iterations.");
        std::endl<char,std::char_traits<char>>(poVar7);
        uintqueue::~uintqueue(&Q);
        bitset::~bitset(&parity);
        bitset::~bitset(&distraction);
        bitset::~bitset(&justified);
        return;
      }
      uVar15 = uVar13 >> 6;
      uVar14 = 1L << (uVar13 & 0x3f);
      uVar18 = (uint)((parity._bits[uVar15] >> (uVar13 & 0x3f) & 1) != 0);
      bVar16 = false;
LAB_0014f371:
      if ((justified._bits[uVar15] & uVar14) == 0) {
        justified._bits[uVar15] = justified._bits[uVar15] | uVar14;
        iVar5 = Solver::owner(&this->super_Solver,vertex);
        pGVar3 = (this->super_Solver).game;
        pbVar4 = (this->super_Solver).disabled;
        puVar8 = (uint *)(pGVar3->_outedges + pGVar3->_firstouts[uVar13]);
        if (iVar5 == 0) {
          while( true ) {
            uVar19 = *puVar8;
            uVar12 = (ulong)(int)uVar19;
            if (uVar12 == 0xffffffffffffffff) break;
            uVar9 = uVar12 >> 6;
            if (((pbVar4->_bits[uVar9] >> (uVar12 & 0x3f) & 1) == 0) &&
               (uVar12 = 1L << (uVar12 & 0x3f),
               ((parity._bits[uVar9] & uVar12) != 0) == ((distraction._bits[uVar9] & uVar12) != 0)))
            {
              uVar11 = 0;
              goto LAB_0014f462;
            }
            puVar8 = puVar8 + 1;
          }
          uVar19 = 0xffffffff;
LAB_0014f45f:
          uVar11 = 1;
        }
        else {
          while( true ) {
            uVar19 = *puVar8;
            uVar12 = (ulong)(int)uVar19;
            if (uVar12 == 0xffffffffffffffff) break;
            uVar9 = uVar12 >> 6;
            if (((pbVar4->_bits[uVar9] >> (uVar12 & 0x3f) & 1) == 0) &&
               (uVar12 = 1L << (uVar12 & 0x3f),
               ((distraction._bits[uVar9] & uVar12) != 0) != ((parity._bits[uVar9] & uVar12) != 0)))
            goto LAB_0014f45f;
            puVar8 = puVar8 + 1;
          }
          uVar11 = 0;
          uVar19 = 0xffffffff;
        }
LAB_0014f462:
        *(uint *)((long)pvVar6 + uVar13 * 4) = uVar19;
        if (uVar18 == uVar11) {
          if (1 < (this->super_Solver).trace) {
            poVar7 = std::operator<<((this->super_Solver).logger,"\x1b[38;5;165;1mjustified\x1b[m ")
            ;
            local_c0.g = (this->super_Solver).game;
            local_c0.v = vertex;
            operator<<(poVar7,&local_c0);
            if (uVar19 != 0xffffffff) {
              poVar7 = std::operator<<((this->super_Solver).logger," => ");
              local_c0.g = (this->super_Solver).game;
              local_c0.v = uVar19;
              operator<<(poVar7,&local_c0);
            }
            std::endl<char,std::char_traits<char>>((this->super_Solver).logger);
          }
        }
        else {
          lVar10 = (long)Q.pointer;
          bVar16 = true;
          Q.pointer = Q.pointer + 1;
          Q.queue[lVar10] = vertex;
          distraction._bits[uVar15] = distraction._bits[uVar15] | uVar14;
          if (1 < (this->super_Solver).trace) {
            poVar7 = std::operator<<((this->super_Solver).logger,"\x1b[38;5;165;1mjustified*\x1b[m "
                                    );
            local_c0.g = (this->super_Solver).game;
            local_c0.v = vertex;
            operator<<(poVar7,&local_c0);
            if (uVar19 != 0xffffffff) {
              poVar7 = std::operator<<((this->super_Solver).logger," => ");
              local_c0.g = (this->super_Solver).game;
              local_c0.v = uVar19;
              operator<<(poVar7,&local_c0);
            }
            std::endl<char,std::char_traits<char>>((this->super_Solver).logger);
            bVar16 = true;
          }
        }
      }
    }
    else {
      uVar15 = uVar13 >> 6;
      if ((((this->super_Solver).disabled)->_bits[uVar15] >> (uVar13 & 0x3f) & 1) == 0) {
        uVar14 = 1L << (uVar13 & 0x3f);
        if (uVar18 != ((parity._bits[uVar15] & uVar14) != 0)) goto LAB_0014f1cb;
        goto LAB_0014f371;
      }
    }
    vertex = vertex + 1;
  } while( true );
}

Assistant:

void
FPJSolver::runSeqGreedy()
{
    /**
     * Allocate and initialize data structures
     */

    int *strategy = new int[nodecount()]; // the current strategy
    bitset justified(nodecount()); // whether a vertex is justified
    bitset distraction(nodecount()); // whether a vertex is won by the opponent

    bitset parity(nodecount()); // optimization: precompute the parity of every vertex's priority
    for (int v=0; v<nodecount(); v++) parity[v] = priority(v)&1;

    uintqueue Q(nodecount());

    /**
     * Initialize loop
     */

    bool blockchanged = false; // did the current block change (new distractions)
    int cur_parity = parity[0]; // parity of current block
    int i = 0; // the current vertex

    for (;;) {
        /**
         * First detect if we are at the end of a block (vertices of same parity)
         */
        bool blockended = false;
        if (i == nodecount()) {
            blockended = true;
        } else {
            if (disabled[i]) { i++; continue; }
            if (parity[i] != cur_parity) blockended = true;
        }

        if (blockended) {
            if (blockchanged) {
                /**
                 * We have to reset all justified vertices that are now no longer justified...
                 */
                while (!Q.empty()) {
                    const int v = Q.pop();
                    for (auto curedge = ins(v); *curedge != -1; curedge++) {
                        const int from = *curedge;
                        if (justified[from]) {
                            if (strategy[from] == -1 or strategy[from] == v) {
#ifndef NDEBUG
                                if (trace >= 2) logger << "\033[31;1mresetting\033[m " << label_vertex(from) << std::endl;
#endif
                                justified[from] = false;
                                distraction[from] = false; // reset it
                                Q.push(from);
                                if (from < i) i = from; // afterwards, continue at lowest unjustified vertex
                            }
                        }
                    }
                }
#ifndef NDEBUG
                if (trace) logger << "restarting after finding distractions of prio " << priority(i-1) << std::endl;
#endif
                iterations++;
                blockchanged = false;
            }

            if (i == nodecount()) break; // in case the last block didn't result in unjustifications

            // continue with the new block, update the current parity
            cur_parity = parity[i];
        }

        // if the current vertex is justified, we don't need to check it
        if (justified[i]) { i++; continue; }
        justified[i] = true;

        // compute one step winner of <i> and update the strategy
        int onestep_winner, str = -1;
        if (owner(i) == 0) {
            // see if player Even can go to a vertex currently good for Even
            onestep_winner = 1;
            for (auto curedge = outs(i); *curedge != -1; curedge++) {
                int to = *curedge;
                if (disabled[to]) continue;
                const int winner_to = parity[to] ^ distraction[to];
                if (winner_to == 0) {
                    // good for player Even
                    onestep_winner = 0;
                    // and set the strategy
                    str = to;
                    break;
                }
            }
        } else {
            // see if player Odd can go to a vertex currently good for Odd
            onestep_winner = 0;
            for (auto curedge = outs(i); *curedge != -1; curedge++) {
                int to = *curedge;
                if (disabled[to]) continue;
                const int winner_to = parity[to] ^ distraction[to];
                if (winner_to == 1) {
                    // good for player Odd
                    onestep_winner = 1;
                    // and set the strategy
                    str = to;
                    break;
                }
            }
        }

        strategy[i] = str;

        // evaluation stays the same
        if (cur_parity != onestep_winner) {
            Q.push(i); // add to the Queue, because all justified predecessors are now invalid
            distraction[i] = true;
            blockchanged = true;
#ifndef NDEBUG
            if (trace >= 2) {
                logger << "\033[38;5;165;1mjustified*\033[m " << label_vertex(i);
                if (strategy[i] != -1) logger << " => " << label_vertex(strategy[i]);
                logger << std::endl;
            }
#endif
        } else {
#ifndef NDEBUG
            if (trace >= 2) {
                logger << "\033[38;5;165;1mjustified\033[m " << label_vertex(i);
                if (strategy[i] != -1) logger << " => " << label_vertex(strategy[i]);
                logger << std::endl;
            }
#endif
        }

        i++;
    }

    // done
    for (int v=0; v<nodecount(); v++) {
        if (disabled[v]) continue;
        const int winner = parity[v] ^ distraction[v];
        Solver::solve(v, winner, winner == owner(v) ? strategy[v] : -1);
    }

    // free allocated data structures
    delete[] strategy;

    logger << "solved with " << iterations << " iterations." << std::endl;
}